

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void pystringtest_pystring_slice(void)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,0);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7d);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_8a);
    pystring::slice(local_68,(int)local_88,0);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,1);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7e);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"\", 1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_8a);
    pystring::slice(local_68,(int)local_88,1);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,-1);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7f);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"\", -1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_8a);
    pystring::slice(local_68,(int)local_88,-1);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,-1);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"\", -1,2)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_8a);
    pystring::slice(local_68,(int)local_88,-1);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,0);
  bVar1 = std::operator==(&local_28,"abcdef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x81);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"abcdef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,0);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"abcdef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,0);
  bVar1 = std::operator==(&local_28,"abcdef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x82);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",0)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"abcdef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,0);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"abcdef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,1);
  bVar1 = std::operator==(&local_28,"bcdef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x83);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"bcdef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,1);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"bcdef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,2);
  bVar1 = std::operator==(&local_28,"cdef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x84);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"cdef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"cdef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,2);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x85);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,2)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,2);
  bVar1 = std::operator==(&local_28,"c");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x86);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,3)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"c\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"c");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,2);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x87);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,2);
  bVar1 = std::operator==(&local_28,"cde");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x88);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,-1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"cde\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"cde");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,2);
  bVar1 = std::operator==(&local_28,"cd");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x89);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,-2)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"cd\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"cd");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,2);
  bVar1 = std::operator==(&local_28,"c");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8a);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,-3)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"c\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"c");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,2);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8b);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,-4)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,2);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8c);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",2,-5)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,-1);
  bVar1 = std::operator==(&local_28,"f");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8d);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"f\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,-1);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"f");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,-2);
  bVar1 = std::operator==(&local_28,"ef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8e);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-2)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"ef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,-2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"ef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,-99);
  bVar1 = std::operator==(&local_28,"abcdef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x8f);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-99)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"abcdef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,-99);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"abcdef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,-99);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x90);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-99,-98)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,-99);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,-2);
  bVar1 = std::operator==(&local_28,"");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x91);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-2, 3)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,-2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,-2);
  bVar1 = std::operator==(&local_28,"ef");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x92);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-2, 10)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"ef\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,-2);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"ef");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,-1);
  bVar1 = std::operator==(&local_28,"f");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x93);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",-1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"f\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,-1);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"f");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcdef",&local_89);
  pystring::slice((string *)&local_28,(int)local_48,0);
  bVar1 = std::operator==(&local_28,"abcde");
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x94);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::slice(\"abcdef\",0,-1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"\"abcde\"");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcdef",&local_8a);
    pystring::slice(local_68,(int)local_88,0);
    poVar2 = std::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::operator<<(poVar2,"abcde");
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

PYSTRING_ADD_TEST(pystring, slice)
{
    PYSTRING_CHECK_EQUAL(pystring::slice(""), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("", 1), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("", -1), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("", -1,2), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef"), "abcdef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",0), "abcdef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",1), "bcdef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2), "cdef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,2), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,3), "c");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,1), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,-1), "cde");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,-2), "cd");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,-3), "c");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,-4), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",2,-5), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-1), "f");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-2), "ef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-99), "abcdef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-99,-98), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-2, 3), "");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-2, 10), "ef");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",-1), "f");
    PYSTRING_CHECK_EQUAL(pystring::slice("abcdef",0,-1), "abcde");
}